

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib575.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  timeval older_01;
  CURLMcode ec_8;
  int ec_7;
  CURLMcode ec_6;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_5;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_40;
  int local_38;
  int local_34;
  int still_running;
  int res;
  CURLM *mhandle;
  CURL *duphandle;
  CURL *handle;
  char *URL_local;
  
  duphandle = (CURL *)0x0;
  mhandle = (CURLM *)0x0;
  _still_running = 0;
  local_34 = 0;
  local_38 = 0;
  handle = (CURL *)URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_40 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_40;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                  ,0x30,iVar2,uVar3);
    local_34 = iVar2;
  }
  if (local_34 == 0) {
    duphandle = (CURL *)curl_easy_init();
    if (duphandle == (CURL *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                    ,0x32);
      local_34 = 0x7c;
    }
    if (local_34 == 0) {
      iVar2 = curl_easy_setopt(duphandle,0x2712,handle);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                      ,0x34,iVar2,uVar3);
        local_34 = iVar2;
      }
      if (local_34 == 0) {
        iVar2 = curl_easy_setopt(duphandle,0xc5,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                        ,0x35,iVar2,uVar3);
          local_34 = iVar2;
        }
        if (local_34 == 0) {
          iVar2 = curl_easy_setopt(duphandle,0x29,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                          ,0x36,iVar2,uVar3);
            local_34 = iVar2;
          }
          if ((((local_34 == 0) && (local_34 = curl_easy_perform(duphandle), local_34 == 0)) &&
              (local_34 = curl_easy_perform(duphandle), local_34 == 0)) &&
             (mhandle = (CURLM *)curl_easy_duphandle(duphandle), mhandle != (CURLM *)0x0)) {
            curl_easy_cleanup(duphandle);
            duphandle = (CURL *)mhandle;
            _still_running = curl_multi_init();
            if (_still_running == 0) {
              curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                            ,0x46);
              local_34 = 0x7b;
            }
            if (local_34 == 0) {
              iVar2 = curl_multi_add_handle(_still_running,duphandle);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                              ,0x48,iVar2,uVar3);
                local_34 = iVar2;
              }
              if (local_34 == 0) {
                iVar2 = curl_multi_perform(_still_running,&local_38);
                uVar1 = _stderr;
                if (iVar2 == 0) {
                  if (local_38 < 0) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                  ,0x4a,local_38);
                    local_34 = 0x7a;
                  }
                }
                else {
                  uVar3 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                ,0x4a,iVar2,uVar3);
                  local_34 = iVar2;
                }
                if (local_34 == 0) {
                  tVar7 = tutil_tvnow();
                  older.tv_usec = tv_test_start.tv_usec;
                  older.tv_sec = tv_test_start.tv_sec;
                  lVar4 = tutil_tvdiff(tVar7,older);
                  if (60000 < lVar4) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                  ,0x4c);
                    local_34 = 0x7d;
                  }
                  while ((local_34 == 0 && (local_38 != 0))) {
                    __arr._4_4_ = -99;
                    fdread.__fds_bits[0xf] = 0;
                    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
                      fdwrite.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
                    }
                    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1)
                    {
                      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                    }
                    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1)
                    {
                      (&__i + (ulong)__arr_2._4_4_ * 2)[0] = 0;
                      (&__i + (ulong)__arr_2._4_4_ * 2)[1] = 0;
                    }
                    iVar2 = curl_multi_fdset(_still_running,fdwrite.__fds_bits + 0xf,
                                             fdexcep.__fds_bits + 0xf,&__i,(long)&__arr + 4);
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      if (__arr._4_4_ < -1) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                      ,0x5c,__arr._4_4_);
                        local_34 = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                    ,0x5c,iVar2,uVar3);
                      local_34 = iVar2;
                    }
                    if (local_34 != 0) break;
                    iVar2 = select_wrapper(__arr._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                           (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&__i,
                                           (timeval *)(fdread.__fds_bits + 0xf));
                    if (iVar2 == -1) {
                      piVar5 = __errno_location();
                      uVar1 = _stderr;
                      iVar2 = *piVar5;
                      pcVar6 = strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                    ,0x60,iVar2,pcVar6);
                      local_34 = 0x79;
                    }
                    if (local_34 != 0) break;
                    tVar7 = tutil_tvnow();
                    older_00.tv_usec = tv_test_start.tv_usec;
                    older_00.tv_sec = tv_test_start.tv_sec;
                    lVar4 = tutil_tvdiff(tVar7,older_00);
                    if (60000 < lVar4) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                    ,0x62);
                      local_34 = 0x7d;
                    }
                    if (local_34 != 0) break;
                    iVar2 = curl_multi_perform(_still_running,&local_38);
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      if (local_38 < 0) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                      ,100,local_38);
                        local_34 = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                    ,100,iVar2,uVar3);
                      local_34 = iVar2;
                    }
                    if (local_34 != 0) break;
                    tVar7 = tutil_tvnow();
                    older_01.tv_usec = tv_test_start.tv_usec;
                    older_01.tv_sec = tv_test_start.tv_sec;
                    lVar4 = tutil_tvdiff(tVar7,older_01);
                    if (60000 < lVar4) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib575.c"
                                    ,0x66);
                      local_34 = 0x7d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_multi_cleanup(_still_running);
    curl_easy_cleanup(duphandle);
    curl_global_cleanup();
    URL_local._4_4_ = local_34;
  }
  else {
    URL_local._4_4_ = local_34;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURL *duphandle = NULL;
  CURLM *mhandle = NULL;
  int res = 0;
  int still_running = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(handle);

  easy_setopt(handle, CURLOPT_URL, URL);
  easy_setopt(handle, CURLOPT_WILDCARDMATCH, 1L);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(handle);
  if(res)
    goto test_cleanup;

  res = curl_easy_perform(handle);
  if(res)
    goto test_cleanup;

  duphandle = curl_easy_duphandle(handle);
  if(!duphandle)
    goto test_cleanup;
  curl_easy_cleanup(handle);
  handle = duphandle;

  multi_init(mhandle);

  multi_add_handle(mhandle, handle);

  multi_perform(mhandle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(mhandle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(mhandle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(mhandle);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}